

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O3

void __thiscall
Hospital::Read_From_File_And_Create_Timetable
          (Hospital *this,
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *Timetable,fstream *inFile)

{
  pointer pbVar1;
  pointer pbVar2;
  long *plVar3;
  long lVar4;
  ostream *poVar5;
  long *plVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  int iVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  temp;
  string item;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  ulong local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  value_type local_50;
  
  if ((*(uint *)(inFile + *(long *)(*(long *)inFile + -0x18) + 0x20) & 5) == 0) {
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    if ((*(uint *)(inFile + *(long *)(*(long *)inFile + -0x18) + 0x20) & 2) == 0) {
      local_70 = 0;
      iVar9 = 0;
      do {
        std::operator>>((istream *)inFile,(string *)&local_50);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_68,&local_50);
        if (iVar9 == 6) {
          std::operator+(&local_90,"    ",
                         local_68.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
          plVar6 = plVar3 + 2;
          if ((long *)*plVar3 == plVar6) {
            local_a0 = *plVar6;
            lStack_98 = plVar3[3];
            local_b0 = &local_a0;
          }
          else {
            local_a0 = *plVar6;
            local_b0 = (long *)*plVar3;
          }
          local_a8 = plVar3[1];
          *plVar3 = (long)plVar6;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          lVar4 = (long)(int)local_70;
          std::__cxx11::string::operator=
                    (*(string **)
                      &(Timetable->
                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[lVar4].
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data,(string *)&local_b0);
          if (local_b0 != &local_a0) {
            operator_delete(local_b0,local_a0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_90,"    ",
                         local_68.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1);
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
          plVar6 = plVar3 + 2;
          if ((long *)*plVar3 == plVar6) {
            local_a0 = *plVar6;
            lStack_98 = plVar3[3];
            local_b0 = &local_a0;
          }
          else {
            local_a0 = *plVar6;
            local_b0 = (long *)*plVar3;
          }
          local_a8 = plVar3[1];
          *plVar3 = (long)plVar6;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          std::__cxx11::string::operator=
                    ((string *)
                     (*(long *)&(Timetable->
                                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[lVar4].
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data + 0x20),(string *)&local_b0);
          if (local_b0 != &local_a0) {
            operator_delete(local_b0,local_a0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_90,"    ",
                         local_68.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 2);
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
          plVar6 = plVar3 + 2;
          if ((long *)*plVar3 == plVar6) {
            local_a0 = *plVar6;
            lStack_98 = plVar3[3];
            local_b0 = &local_a0;
          }
          else {
            local_a0 = *plVar6;
            local_b0 = (long *)*plVar3;
          }
          local_a8 = plVar3[1];
          *plVar3 = (long)plVar6;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          std::__cxx11::string::operator=
                    ((string *)
                     (*(long *)&(Timetable->
                                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[lVar4].
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data + 0x40),(string *)&local_b0);
          if (local_b0 != &local_a0) {
            operator_delete(local_b0,local_a0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_90,"    ",
                         local_68.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 3);
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
          plVar6 = plVar3 + 2;
          if ((long *)*plVar3 == plVar6) {
            local_a0 = *plVar6;
            lStack_98 = plVar3[3];
            local_b0 = &local_a0;
          }
          else {
            local_a0 = *plVar6;
            local_b0 = (long *)*plVar3;
          }
          local_a8 = plVar3[1];
          *plVar3 = (long)plVar6;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          std::__cxx11::string::operator=
                    ((string *)
                     (*(long *)&(Timetable->
                                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[lVar4].
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data + 0x60),(string *)&local_b0);
          if (local_b0 != &local_a0) {
            operator_delete(local_b0,local_a0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_90,"    ",
                         local_68.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 4);
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
          plVar6 = plVar3 + 2;
          if ((long *)*plVar3 == plVar6) {
            local_a0 = *plVar6;
            lStack_98 = plVar3[3];
            local_b0 = &local_a0;
          }
          else {
            local_a0 = *plVar6;
            local_b0 = (long *)*plVar3;
          }
          local_a8 = plVar3[1];
          *plVar3 = (long)plVar6;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          std::__cxx11::string::operator=
                    ((string *)
                     (*(long *)&(Timetable->
                                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[lVar4].
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data + 0x80),(string *)&local_b0);
          if (local_b0 != &local_a0) {
            operator_delete(local_b0,local_a0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_90,"    ",
                         local_68.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 5);
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
          plVar6 = plVar3 + 2;
          if ((long *)*plVar3 == plVar6) {
            local_a0 = *plVar6;
            lStack_98 = plVar3[3];
            local_b0 = &local_a0;
          }
          else {
            local_a0 = *plVar6;
            local_b0 = (long *)*plVar3;
          }
          local_a8 = plVar3[1];
          *plVar3 = (long)plVar6;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          std::__cxx11::string::operator=
                    ((string *)
                     (*(long *)&(Timetable->
                                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[lVar4].
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data + 0xa0),(string *)&local_b0);
          if (local_b0 != &local_a0) {
            operator_delete(local_b0,local_a0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          pbVar2 = local_68.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar1 = local_68.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar9 = (int)local_70;
          if (local_68.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_68.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            paVar7 = &(local_68.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->field_2;
            do {
              plVar3 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(paVar7 + -1))->_M_dataplus)._M_p;
              if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)plVar3) {
                operator_delete(plVar3,paVar7->_M_allocated_capacity + 1);
              }
              pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (paVar7 + 1);
              paVar7 = paVar7 + 2;
            } while (pbVar8 != pbVar2);
            local_68.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar1;
            iVar9 = (int)local_70;
          }
          local_70 = (ulong)(iVar9 + 1);
          iVar9 = 0;
        }
      } while ((((byte)inFile[*(long *)(*(long *)inFile + -0x18) + 0x20] & 2) == 0) &&
              (iVar9 = iVar9 + 1, (int)local_70 != 7));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    return;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"Error opening file 3!!! ");
  std::endl<char,std::char_traits<char>>(poVar5);
  exit(1);
}

Assistant:

void Hospital::Read_From_File_And_Create_Timetable (vector<vector<string>>& Timetable , fstream& inFile) {

    if (inFile.fail()){
        cerr << "Error opening file 3!!! " <<endl;
        exit(1) ;
    }

    vector<string>temp;
    string item;
    int counter=0 , index = 0;

    while(!inFile.eof() && index != 7 ) {
        inFile >> item ;
        temp.push_back(item);

        if(counter==6){
            Timetable[index][0] ="    "+ temp[0]+ "    ";
            Timetable[index][1] ="    "+ temp[1]+ "    ";
            Timetable[index][2] ="    "+ temp[2]+ "    ";
            Timetable[index][3] ="    "+ temp[3]+ "    ";
            Timetable[index][4] ="    "+ temp[4]+ "    ";
            Timetable[index][5] ="    "+ temp[5]+ "    ";

//            Timetable[index][0] =temp[0];
//            Timetable[index][1] =temp[1];
//            Timetable[index][2] =temp[2];
//            Timetable[index][3] =temp[3];
//            Timetable[index][4] =temp[4];
//            Timetable[index][5] =temp[5];

            temp.clear();
            counter = 0;
            index++;
        }
        counter++;
    }

}